

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_state_utils.cpp
# Opt level: O3

void Redistribution::MakeStateRedistUtils
               (Box *bx,Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *vfrac,
               Array4<const_double> *ccent,Array4<const_int> *itracker,Array4<double> *nrs,
               Array4<double> *alpha,Array4<double> *nbhd_vol,Array4<double> *cent_hat,
               Geometry *lev_geom,Real target_vol)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  EBCellFlag *pEVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined8 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  double *pdVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  long lVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  int *piVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  long lVar84;
  int iVar85;
  long lVar86;
  int *piVar87;
  long lVar88;
  long lVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  long lVar93;
  undefined4 *puVar94;
  long lVar95;
  long lVar96;
  int *piVar97;
  double **ppdVar98;
  undefined8 *puVar99;
  long *plVar100;
  undefined4 *puVar101;
  int iVar102;
  long lVar103;
  int iVar104;
  long lVar105;
  long lVar106;
  int iVar107;
  int iVar108;
  long lVar109;
  long lVar110;
  ulong uVar111;
  long lVar112;
  bool bVar113;
  int *local_5d8;
  long local_5b8;
  int local_5b0;
  long local_5a8;
  int local_590;
  int *local_580;
  int *local_578;
  int *local_570;
  int *local_540;
  int *local_530;
  long local_508;
  int *local_500;
  int local_358;
  int iStack_354;
  int iStack_350;
  double *local_338;
  long lStack_330;
  long local_328;
  Long LStack_320;
  undefined8 local_318;
  int iStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined8 uStack_304;
  double *local_2f8;
  long lStack_2f0;
  long local_2e8;
  Long LStack_2e0;
  undefined8 local_2d8;
  int iStack_2d0;
  int aiStack_2cc [2];
  undefined8 uStack_2c4;
  double *local_2b8;
  long lStack_2b0;
  long local_2a8;
  Long LStack_2a0;
  undefined8 local_298;
  int iStack_290;
  int aiStack_28c [2];
  undefined8 uStack_284;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  int iStack_250;
  int iStack_24c;
  int local_248;
  uint local_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  long lStack_238;
  long local_230;
  long lStack_228;
  undefined8 local_220;
  int iStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined8 uStack_20c;
  int local_200 [4];
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  uint local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc [5];
  double *local_1b8;
  double *pdStack_1b0;
  long local_1a8;
  Long LStack_1a0;
  undefined8 local_198;
  int iStack_190;
  int iStack_18c;
  int local_188;
  undefined4 local_184;
  undefined4 uStack_180;
  undefined8 uStack_17c;
  double *local_170;
  long lStack_168;
  long local_160;
  Long LStack_158;
  undefined8 local_150;
  int iStack_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined8 uStack_13c;
  int local_128 [14];
  double *local_f0;
  long lStack_e8;
  long local_e0;
  long lStack_d8;
  undefined8 local_d0;
  int iStack_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long lStack_b0;
  long local_a8;
  Long LStack_a0;
  undefined8 local_98;
  int local_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  double *local_78;
  long lStack_70;
  long local_68;
  Long LStack_60;
  undefined8 local_58;
  int iStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  iVar68 = (bx->smallend).vect[0];
  iVar90 = (lev_geom->domain).smallend.vect[0];
  iVar92 = (lev_geom->domain).smallend.vect[1];
  iVar69 = (lev_geom->domain).smallend.vect[2];
  iVar102 = (lev_geom->domain).bigend.vect[0];
  iVar91 = (lev_geom->domain).bigend.vect[1];
  iVar81 = (lev_geom->domain).bigend.vect[2];
  bVar113 = (lev_geom->super_CoordSys).field_0x51 == '\0';
  iVar85 = iVar102 + 2;
  if (bVar113) {
    iVar85 = iVar102;
  }
  iVar102 = iVar90 + -2;
  if (bVar113) {
    iVar102 = iVar90;
  }
  bVar113 = (lev_geom->super_CoordSys).field_0x52 == '\0';
  iVar90 = iVar91 + 2;
  if (bVar113) {
    iVar90 = iVar91;
  }
  iVar91 = iVar92 + -2;
  if (bVar113) {
    iVar91 = iVar92;
  }
  bVar113 = (lev_geom->super_CoordSys).field_0x53 == '\0';
  iVar92 = iVar81 + 2;
  if (bVar113) {
    iVar92 = iVar81;
  }
  iVar81 = iVar69 + -2;
  if (bVar113) {
    iVar81 = iVar69;
  }
  iVar69 = (bx->smallend).vect[1];
  iVar70 = (bx->smallend).vect[2];
  iVar5 = (bx->bigend).vect[0];
  iVar71 = (bx->bigend).vect[1];
  iVar75 = (bx->bigend).vect[2];
  uVar6 = (bx->btype).itype;
  uVar7 = (lev_geom->domain).btype.itype;
  iVar61 = iVar68 + -3;
  iVar62 = iVar69 + -3;
  iVar73 = iVar70 + -3;
  iVar63 = iVar5 + 3;
  iVar64 = iVar71 + 3;
  iVar65 = iVar75 + 3;
  iVar82 = iVar71 + 4;
  if (iVar73 <= iVar65) {
    lVar9 = nrs->jstride;
    lVar79 = nrs->kstride;
    iVar66 = (nrs->begin).z;
    pdVar10 = alpha->p;
    lVar77 = alpha->kstride;
    lVar78 = alpha->nstride;
    iVar67 = (alpha->begin).z;
    lVar86 = (long)(alpha->begin).x;
    iVar74 = (nrs->begin).y;
    lVar84 = (long)iVar62;
    lVar1 = (long)iVar61 * 8 + (lVar84 - (alpha->begin).y) * alpha->jstride * 8;
    iVar83 = (nrs->begin).x;
    lVar93 = alpha->jstride * 8;
    pdVar11 = nrs->p;
    iVar104 = iVar73;
    do {
      if (iVar62 <= iVar64) {
        lVar88 = ((long)iVar104 - (long)iVar67) * lVar77 * 8;
        lVar76 = (long)pdVar10 + lVar88 + lVar1 + lVar78 * 8 + lVar86 * -8;
        lVar89 = (long)pdVar10 + lVar88 + lVar1 + lVar86 * -8;
        lVar109 = (long)pdVar11 +
                  ((long)iVar104 - (long)iVar66) * lVar79 * 8 +
                  (long)iVar61 * 8 + (lVar84 - iVar74) * lVar9 * 8 + (long)iVar83 * -8;
        lVar88 = lVar84;
        do {
          if (iVar61 <= iVar63) {
            lVar96 = 0;
            do {
              *(undefined8 *)(lVar109 + lVar96 * 8) = 0x3ff0000000000000;
              *(undefined8 *)(lVar89 + lVar96 * 8) = 0x3ff0000000000000;
              *(undefined8 *)(lVar76 + lVar96 * 8) = 0x3ff0000000000000;
              lVar96 = lVar96 + 1;
            } while ((iVar5 - iVar68) + 7 != (int)lVar96);
          }
          lVar88 = lVar88 + 1;
          lVar76 = lVar76 + lVar93;
          lVar89 = lVar89 + lVar93;
          lVar109 = lVar109 + lVar9 * 8;
        } while (iVar82 != (int)lVar88);
      }
      bVar113 = iVar104 != iVar65;
      iVar104 = iVar104 + 1;
    } while (bVar113);
  }
  iVar66 = iVar70 + -2;
  iVar67 = iVar75 + 2;
  piVar80 = itracker->p;
  lVar1 = itracker->jstride;
  lVar9 = itracker->kstride;
  lVar79 = itracker->nstride;
  uVar14 = (itracker->begin).x;
  uVar15 = (itracker->begin).y;
  iStack_350 = (int)*(undefined8 *)&(itracker->begin).z;
  puVar94 = &DAT_00762c58;
  ppdVar98 = &local_338;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)ppdVar98 = *puVar94;
    puVar94 = puVar94 + 1;
    ppdVar98 = (double **)((long)ppdVar98 + 4);
  }
  piVar87 = &DAT_00762cc4;
  piVar97 = aiStack_2cc;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *piVar97 = *piVar87;
    piVar87 = piVar87 + 1;
    piVar97 = piVar97 + 1;
  }
  puVar94 = &DAT_00762d30;
  puVar99 = &uStack_260;
  for (lVar77 = 0x1b; lVar77 != 0; lVar77 = lVar77 + -1) {
    *(undefined4 *)puVar99 = *puVar94;
    puVar94 = puVar94 + 1;
    puVar99 = (undefined8 *)((long)puVar99 + 4);
  }
  local_200[3] = iVar102;
  local_1f0 = iVar91;
  local_1ec = iVar81;
  local_1e8 = iVar85;
  local_1e4 = iVar90;
  local_1e0 = iVar92;
  local_1dc = uVar7;
  local_1d8 = iVar61;
  local_1d4 = iVar62;
  local_1d0 = iVar73;
  local_1cc[0] = iVar63;
  local_1cc[1] = iVar64;
  local_1cc[2] = iVar65;
  local_1cc[3] = uVar6;
  local_1b8 = nrs->p;
  pdStack_1b0 = (double *)nrs->jstride;
  local_1a8 = nrs->kstride;
  local_198._0_4_ = (nrs->begin).x;
  local_198._4_4_ = (nrs->begin).y;
  uVar16 = (nrs->end).x;
  uVar17 = (nrs->end).y;
  uVar18 = *(undefined8 *)&(nrs->end).z;
  LStack_1a0 = nrs->nstride;
  iStack_190 = (int)*(undefined8 *)&(nrs->begin).z;
  iStack_18c = uVar16;
  local_188 = uVar17;
  local_184 = (undefined4)uVar18;
  uStack_180 = (undefined4)((ulong)uVar18 >> 0x20);
  if (iVar70 + -4 <= iVar75 + 4) {
    iVar74 = iVar68 + -4;
    iVar83 = iVar69 + -4;
    iVar70 = iVar70 + -4;
    do {
      if (iVar83 <= iVar82) {
        lVar77 = (long)iVar70;
        local_5d8 = (int *)((long)piVar80 +
                           (lVar77 - iStack_350) * lVar9 * 4 +
                           ((long)iVar83 - (long)(int)uVar15) * lVar1 * 4 + lVar79 * 4 +
                           (long)iVar74 * 4 + (long)(int)uVar14 * -4);
        local_5a8 = (long)iVar83;
        do {
          if (iVar74 <= iVar5 + 4) {
            lVar78 = (long)iVar74;
            piVar87 = local_5d8;
            do {
              uVar8 = piVar80[(lVar77 - iStack_350) * lVar9 +
                              (local_5a8 - (int)uVar15) * lVar1 + (lVar78 - (int)uVar14)];
              uVar111 = (ulong)uVar8;
              if (0 < (int)uVar8) {
                piVar97 = piVar87;
                do {
                  lVar86 = (long)*piVar97;
                  lVar84 = (long)*(int *)((long)&local_338 + lVar86 * 4) + (long)(int)lVar78;
                  iVar104 = (int)lVar84;
                  if (iVar102 <= iVar104) {
                    lVar93 = (long)aiStack_2cc[lVar86] + (long)(int)local_5a8;
                    iVar108 = (int)lVar93;
                    if (iVar91 <= iVar108) {
                      lVar86 = *(int *)((long)&uStack_260 + lVar86 * 4) + lVar77;
                      iVar107 = (int)lVar86;
                      if (((((iVar107 <= iVar92 && iVar81 <= iVar107) &&
                             (iVar108 <= iVar90 && iVar104 <= iVar85)) && (iVar61 <= iVar104)) &&
                          (iVar62 <= iVar108)) &&
                         ((iVar107 <= iVar65 && iVar73 <= iVar107) &&
                          (iVar108 <= iVar64 && iVar104 <= iVar63))) {
                        lVar84 = lVar84 - (int)(undefined4)local_198;
                        lVar93 = (lVar93 - (int)local_198._4_4_) * (long)pdStack_1b0;
                        lVar86 = (lVar86 - iStack_190) * local_1a8;
                        local_1b8[lVar93 + lVar84 + lVar86] =
                             local_1b8[lVar93 + lVar84 + lVar86] + 1.0;
                      }
                    }
                  }
                  piVar97 = piVar97 + lVar79;
                  uVar111 = uVar111 - 1;
                } while (uVar111 != 0);
              }
              lVar78 = lVar78 + 1;
              piVar87 = piVar87 + 1;
            } while (iVar5 + 5 != (int)lVar78);
          }
          local_5a8 = local_5a8 + 1;
          local_5d8 = local_5d8 + lVar1;
        } while (iVar71 + 5 != (int)local_5a8);
      }
      bVar113 = iVar70 != iVar75 + 4;
      iVar70 = iVar70 + 1;
    } while (bVar113);
  }
  pEVar19 = flag->p;
  lVar1 = flag->jstride;
  lVar9 = flag->kstride;
  uVar20 = (flag->begin).x;
  uVar21 = (flag->begin).y;
  iStack_350 = (int)*(undefined8 *)&(flag->begin).z;
  local_338 = nbhd_vol->p;
  lStack_330 = nbhd_vol->jstride;
  local_328 = nbhd_vol->kstride;
  local_318._0_4_ = (nbhd_vol->begin).x;
  local_318._4_4_ = (nbhd_vol->begin).y;
  uVar18 = *(undefined8 *)&(nbhd_vol->begin).z;
  uVar22 = (nbhd_vol->end).y;
  uStack_308 = uVar22;
  uStack_304 = *(undefined8 *)&(nbhd_vol->end).z;
  iStack_310 = (int)uVar18;
  uStack_30c = (undefined4)((ulong)uVar18 >> 0x20);
  LStack_320 = nbhd_vol->nstride;
  local_2f8 = vfrac->p;
  lStack_2f0 = vfrac->jstride;
  local_2e8 = vfrac->kstride;
  local_2d8._0_4_ = (vfrac->begin).x;
  local_2d8._4_4_ = (vfrac->begin).y;
  uVar23 = (vfrac->end).x;
  uVar24 = (vfrac->end).y;
  LStack_2e0 = vfrac->nstride;
  iStack_2d0 = (int)*(undefined8 *)&(vfrac->begin).z;
  aiStack_2cc[0] = uVar23;
  aiStack_2cc[1] = uVar24;
  uStack_2c4 = *(undefined8 *)&(vfrac->end).z;
  local_2b8 = nrs->p;
  lStack_2b0 = nrs->jstride;
  local_2a8 = nrs->kstride;
  local_298._0_4_ = (nrs->begin).x;
  local_298._4_4_ = (nrs->begin).y;
  uVar25 = (nrs->end).x;
  uVar26 = (nrs->end).y;
  LStack_2a0 = nrs->nstride;
  iStack_290 = (int)*(undefined8 *)&(nrs->begin).z;
  aiStack_28c[0] = uVar25;
  aiStack_28c[1] = uVar26;
  uStack_284 = *(undefined8 *)&(nrs->end).z;
  local_278 = itracker->p;
  uStack_270 = itracker->jstride;
  local_268 = itracker->kstride;
  uStack_260 = itracker->nstride;
  local_258._0_4_ = (itracker->begin).x;
  local_258._4_4_ = (itracker->begin).y;
  uVar27 = (itracker->end).x;
  uVar28 = (itracker->end).y;
  uVar18 = *(undefined8 *)&(itracker->end).z;
  iStack_250 = (int)*(undefined8 *)&(itracker->begin).z;
  iStack_24c = uVar27;
  local_248 = uVar28;
  local_244 = (uint)uVar18;
  local_240 = (undefined4)((ulong)uVar18 >> 0x20);
  puVar94 = &DAT_00762c58;
  plVar100 = &lStack_238;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  piVar80 = &DAT_00762cc4;
  piVar87 = local_1cc;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *piVar87 = *piVar80;
    piVar80 = piVar80 + 1;
    piVar87 = piVar87 + 1;
  }
  puVar94 = &DAT_00762d30;
  plVar100 = &local_160;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  local_f0 = alpha->p;
  lStack_e8 = alpha->jstride;
  local_e0 = alpha->kstride;
  lStack_d8 = alpha->nstride;
  local_d0._0_4_ = (alpha->begin).x;
  local_d0._4_4_ = (alpha->begin).y;
  uVar18 = *(undefined8 *)&(alpha->begin).z;
  uVar29 = (alpha->end).y;
  uVar30 = *(undefined8 *)&(alpha->end).z;
  uStack_c0 = uVar29;
  uStack_bc = (undefined4)uVar30;
  uStack_b8 = (undefined4)((ulong)uVar30 >> 0x20);
  iStack_c8 = (int)uVar18;
  uStack_c4 = (undefined4)((ulong)uVar18 >> 0x20);
  iVar68 = iVar68 + -2;
  iVar69 = iVar69 + -2;
  iVar70 = iVar5 + 2;
  iVar71 = iVar71 + 2;
  if (iVar66 <= iVar67) {
    iVar75 = iVar66;
    do {
      if (iVar69 <= iVar71) {
        lVar77 = (long)iVar75;
        local_580 = (int *)((long)local_278 +
                           (lVar77 - iStack_250) * local_268 * 4 +
                           uStack_260 * 4 +
                           ((long)iVar69 - (long)(int)local_258._4_4_) * uStack_270 * 4 +
                           (long)iVar68 * 4 + (long)(int)(undefined4)local_258 * -4);
        lVar84 = (iVar75 - iStack_2d0) * local_2e8;
        lVar86 = (lVar77 - iStack_310) * local_328;
        lVar78 = (lVar77 - iStack_c8) * local_e0;
        lVar79 = (long)iVar69;
        do {
          if (iVar68 <= iVar70) {
            lVar76 = (lVar79 - (int)local_2d8._4_4_) * lStack_2f0;
            lVar88 = (lVar79 - (int)local_318._4_4_) * lStack_330;
            lVar89 = (lVar79 - (int)local_d0._4_4_) * lStack_e8;
            local_530 = local_580;
            lVar93 = (long)iVar68;
            do {
              if ((~pEVar19[(lVar77 - iStack_350) * lVar9 +
                            (lVar79 - (int)uVar21) * lVar1 + (lVar93 - (int)uVar20)].flag & 3) == 0)
              {
                local_338[lVar86 + lVar88 + (lVar93 - (int)(undefined4)local_318)] = 0.0;
                local_f0[lVar78 + lVar89 + (lVar93 - (int)(undefined4)local_d0)] = 0.0;
                (local_f0 + lVar78 + lVar89 + (lVar93 - (int)(undefined4)local_d0))[lStack_d8] = 0.0
                ;
              }
              else {
                dVar12 = local_2f8[lVar84 + lVar76 + (lVar93 - (int)(undefined4)local_2d8)] /
                         local_2b8[(iVar75 - iStack_290) * local_2a8 +
                                   (lVar79 - (int)local_298._4_4_) * lStack_2b0 +
                                   (lVar93 - (int)(undefined4)local_298)];
                lVar109 = lVar93 - (int)(undefined4)local_318;
                local_338[lVar86 + lVar88 + lVar109] = dVar12;
                uVar111 = (ulong)(uint)local_278[(lVar77 - iStack_250) * local_268 +
                                                 (lVar79 - (int)local_258._4_4_) * uStack_270 +
                                                 (lVar93 - (int)(undefined4)local_258)];
                if (0 < local_278[(lVar77 - iStack_250) * local_268 +
                                  (lVar79 - (int)local_258._4_4_) * uStack_270 +
                                  (lVar93 - (int)(undefined4)local_258)]) {
                  dVar13 = 0.0;
                  piVar80 = local_530;
                  do {
                    lVar103 = (long)*piVar80;
                    iVar74 = *(int *)((long)&lStack_238 + lVar103 * 4) + (int)lVar93;
                    local_590 = (int)lVar79;
                    iVar83 = *(int *)((long)&local_160 + lVar103 * 4) + iVar75;
                    lVar95 = (long)(iVar74 - (undefined4)local_2d8);
                    lVar96 = ((local_1cc[lVar103] + local_590) - local_2d8._4_4_) * lStack_2f0;
                    lVar72 = (iVar83 - iStack_2d0) * local_2e8;
                    dVar12 = dVar12 + local_2f8[lVar96 + lVar95 + lVar72] /
                                      local_2b8[((local_1cc[lVar103] + local_590) - local_298._4_4_)
                                                * lStack_2b0 +
                                                (long)(iVar74 - (undefined4)local_298) +
                                                (iVar83 - iStack_290) * local_2a8];
                    local_338[lVar86 + lVar88 + lVar109] = dVar12;
                    dVar13 = dVar13 + local_2f8[lVar96 + lVar95 + lVar72];
                    piVar80 = piVar80 + uStack_260;
                    uVar111 = uVar111 - 1;
                  } while (uVar111 != 0);
                  local_f0[lVar78 + lVar89 + lStack_d8 + (lVar93 - (int)(undefined4)local_d0)] =
                       (target_vol -
                       local_2f8[lVar84 + lVar76 + (lVar93 - (int)(undefined4)local_2d8)]) / dVar13;
                }
              }
              lVar93 = lVar93 + 1;
              local_530 = local_530 + 1;
            } while (iVar63 != (int)lVar93);
          }
          lVar79 = lVar79 + 1;
          local_580 = local_580 + uStack_270;
        } while (iVar64 != (int)lVar79);
      }
      bVar113 = iVar75 != iVar67;
      iVar75 = iVar75 + 1;
    } while (bVar113);
  }
  pEVar19 = flag->p;
  lVar1 = flag->jstride;
  lVar9 = flag->kstride;
  uVar31 = (flag->begin).x;
  uVar32 = (flag->begin).y;
  iStack_350 = (int)*(undefined8 *)&(flag->begin).z;
  local_338 = (double *)itracker->p;
  lStack_330 = itracker->jstride;
  local_328 = itracker->kstride;
  LStack_320 = itracker->nstride;
  local_318._0_4_ = (itracker->begin).x;
  local_318._4_4_ = (itracker->begin).y;
  uVar33 = (itracker->end).x;
  uVar34 = (itracker->end).y;
  iStack_310 = (int)*(undefined8 *)&(itracker->begin).z;
  uStack_30c = uVar33;
  uStack_308 = uVar34;
  uStack_304 = *(undefined8 *)&(itracker->end).z;
  puVar94 = &DAT_00762c58;
  ppdVar98 = &local_2f8;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *(undefined4 *)ppdVar98 = *puVar94;
    puVar94 = puVar94 + 1;
    ppdVar98 = (double **)((long)ppdVar98 + 4);
  }
  piVar80 = &DAT_00762cc4;
  piVar87 = aiStack_28c;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *piVar87 = *piVar80;
    piVar80 = piVar80 + 1;
    piVar87 = piVar87 + 1;
  }
  puVar94 = &DAT_00762d30;
  puVar99 = &local_220;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *(undefined4 *)puVar99 = *puVar94;
    puVar94 = puVar94 + 1;
    puVar99 = (undefined8 *)((long)puVar99 + 4);
  }
  pdStack_1b0 = alpha->p;
  local_1a8 = alpha->jstride;
  LStack_1a0 = alpha->kstride;
  local_198 = alpha->nstride;
  uVar35 = (alpha->begin).x;
  uVar36 = (alpha->begin).y;
  uVar18 = *(undefined8 *)&(alpha->begin).z;
  uVar37 = (alpha->end).y;
  uStack_180 = uVar37;
  uStack_17c = *(undefined8 *)&(alpha->end).z;
  iStack_190 = uVar35;
  iStack_18c = uVar36;
  local_188 = (int)uVar18;
  local_184 = (undefined4)((ulong)uVar18 >> 0x20);
  local_170 = nrs->p;
  lStack_168 = nrs->jstride;
  local_160 = nrs->kstride;
  local_150._0_4_ = (nrs->begin).x;
  local_150._4_4_ = (nrs->begin).y;
  uVar38 = (nrs->end).x;
  uVar39 = (nrs->end).y;
  LStack_158 = nrs->nstride;
  iStack_148 = (int)*(undefined8 *)&(nrs->begin).z;
  uStack_144 = uVar38;
  uStack_140 = uVar39;
  uStack_13c = *(undefined8 *)&(nrs->end).z;
  if (iVar66 <= iVar67) {
    iVar75 = iVar66;
    do {
      if (iVar69 <= iVar71) {
        lVar79 = (long)iVar75;
        local_578 = (int *)((long)local_338 +
                           (lVar79 - iStack_310) * local_328 * 4 +
                           LStack_320 * 4 +
                           ((long)iVar69 - (long)(int)local_318._4_4_) * lStack_330 * 4 +
                           (long)iVar68 * 4 + (long)(int)(undefined4)local_318 * -4);
        local_5b8 = (long)iVar69;
        do {
          if (iVar68 <= iVar70) {
            local_570 = local_578;
            lVar77 = (long)iVar68;
            do {
              if (((~pEVar19[(lVar79 - iStack_350) * lVar9 +
                             (local_5b8 - (int)uVar32) * lVar1 + (lVar77 - (int)uVar31)].flag & 3)
                   != 0) &&
                 (uVar8 = *(uint *)((long)local_338 +
                                   ((lVar79 - iStack_310) * local_328 +
                                   (local_5b8 - (int)local_318._4_4_) * lStack_330 +
                                   (lVar77 - (int)(undefined4)local_318)) * 4),
                 uVar111 = (ulong)uVar8, 0 < (int)uVar8)) {
                piVar80 = local_570;
                do {
                  lVar84 = (long)*piVar80;
                  lVar88 = (long)*(int *)((long)&local_2f8 + lVar84 * 4) + (long)(int)lVar77;
                  lVar78 = (long)aiStack_28c[lVar84] + (long)(int)local_5b8;
                  lVar76 = *(int *)((long)&local_220 + lVar84 * 4) + lVar79;
                  lVar84 = (long)((int)lVar88 - iStack_190);
                  lVar86 = ((int)lVar78 - iStack_18c) * local_1a8;
                  lVar93 = ((int)lVar76 - local_188) * LStack_1a0;
                  pdStack_1b0[lVar86 + lVar84 + lVar93] =
                       pdStack_1b0[lVar86 + lVar84 + lVar93] -
                       pdStack_1b0
                       [local_198 +
                        (iVar75 - local_188) * LStack_1a0 +
                        (local_5b8 - iStack_18c) * local_1a8 + (lVar77 - iStack_190)] /
                       local_170[(lVar78 - (int)local_150._4_4_) * lStack_168 +
                                 (lVar88 - (int)(undefined4)local_150) +
                                 (lVar76 - iStack_148) * local_160];
                  piVar80 = piVar80 + LStack_320;
                  uVar111 = uVar111 - 1;
                } while (uVar111 != 0);
              }
              lVar77 = lVar77 + 1;
              local_570 = local_570 + 1;
            } while (iVar63 != (int)lVar77);
          }
          local_5b8 = local_5b8 + 1;
          local_578 = local_578 + lStack_330;
        } while (iVar64 != (int)local_5b8);
      }
      bVar113 = iVar75 != iVar67;
      iVar75 = iVar75 + 1;
    } while (bVar113);
  }
  pEVar19 = flag->p;
  lVar1 = flag->jstride;
  lVar9 = flag->kstride;
  uVar40 = (flag->begin).x;
  uVar41 = (flag->begin).y;
  iStack_350 = (int)*(undefined8 *)&(flag->begin).z;
  local_338 = nbhd_vol->p;
  lStack_330 = nbhd_vol->jstride;
  local_328 = nbhd_vol->kstride;
  local_318._0_4_ = (nbhd_vol->begin).x;
  local_318._4_4_ = (nbhd_vol->begin).y;
  uVar18 = *(undefined8 *)&(nbhd_vol->begin).z;
  uVar42 = (nbhd_vol->end).y;
  uStack_308 = uVar42;
  uStack_304 = *(undefined8 *)&(nbhd_vol->end).z;
  iStack_310 = (int)uVar18;
  uStack_30c = (undefined4)((ulong)uVar18 >> 0x20);
  LStack_320 = nbhd_vol->nstride;
  local_2f8 = alpha->p;
  lStack_2f0 = alpha->jstride;
  local_2e8 = alpha->kstride;
  LStack_2e0 = alpha->nstride;
  local_2d8._0_4_ = (alpha->begin).x;
  local_2d8._4_4_ = (alpha->begin).y;
  uVar43 = (alpha->end).x;
  uVar44 = (alpha->end).y;
  iStack_2d0 = (int)*(undefined8 *)&(alpha->begin).z;
  aiStack_2cc[0] = uVar43;
  aiStack_2cc[1] = uVar44;
  uStack_2c4 = *(undefined8 *)&(alpha->end).z;
  local_2b8 = vfrac->p;
  lStack_2b0 = vfrac->jstride;
  local_2a8 = vfrac->kstride;
  local_298._0_4_ = (vfrac->begin).x;
  local_298._4_4_ = (vfrac->begin).y;
  uVar45 = (vfrac->end).x;
  uVar46 = (vfrac->end).y;
  LStack_2a0 = vfrac->nstride;
  iStack_290 = (int)*(undefined8 *)&(vfrac->begin).z;
  aiStack_28c[0] = uVar45;
  aiStack_28c[1] = uVar46;
  uStack_284 = *(undefined8 *)&(vfrac->end).z;
  local_278 = itracker->p;
  uStack_270 = itracker->jstride;
  local_268 = itracker->kstride;
  uStack_260 = itracker->nstride;
  local_258._0_4_ = (itracker->begin).x;
  local_258._4_4_ = (itracker->begin).y;
  uVar47 = (itracker->end).x;
  uVar48 = (itracker->end).y;
  uVar18 = *(undefined8 *)&(itracker->end).z;
  iStack_250 = (int)*(undefined8 *)&(itracker->begin).z;
  iStack_24c = uVar47;
  local_248 = uVar48;
  local_244 = (uint)uVar18;
  local_240 = (undefined4)((ulong)uVar18 >> 0x20);
  puVar94 = &DAT_00762c58;
  plVar100 = &lStack_238;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  piVar80 = &DAT_00762cc4;
  piVar87 = local_1cc;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *piVar87 = *piVar80;
    piVar80 = piVar80 + 1;
    piVar87 = piVar87 + 1;
  }
  puVar94 = &DAT_00762d30;
  plVar100 = &local_160;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *(undefined4 *)plVar100 = *puVar94;
    puVar94 = puVar94 + 1;
    plVar100 = (long *)((long)plVar100 + 4);
  }
  local_f0 = nrs->p;
  lStack_e8 = nrs->jstride;
  local_e0 = nrs->kstride;
  local_d0._0_4_ = (nrs->begin).x;
  local_d0._4_4_ = (nrs->begin).y;
  uVar18 = *(undefined8 *)&(nrs->begin).z;
  uVar49 = (nrs->end).y;
  uVar30 = *(undefined8 *)&(nrs->end).z;
  uStack_c0 = uVar49;
  uStack_bc = (undefined4)uVar30;
  uStack_b8 = (undefined4)((ulong)uVar30 >> 0x20);
  iStack_c8 = (int)uVar18;
  uStack_c4 = (undefined4)((ulong)uVar18 >> 0x20);
  lStack_d8 = nrs->nstride;
  if (iVar66 <= iVar67) {
    iVar75 = iVar66;
    do {
      if (iVar69 <= iVar71) {
        lVar78 = (long)iVar75;
        local_500 = (int *)((long)local_278 +
                           (lVar78 - iStack_250) * local_268 * 4 +
                           uStack_260 * 4 +
                           ((long)iVar69 - (long)(int)local_258._4_4_) * uStack_270 * 4 +
                           (long)iVar68 * 4 + (long)(int)(undefined4)local_258 * -4);
        lVar79 = (lVar78 - iStack_2d0) * local_2e8;
        lVar77 = (lVar78 - iStack_310) * local_328;
        local_508 = (long)iVar69;
        do {
          if (iVar68 <= iVar70) {
            lVar86 = (local_508 - (int)local_2d8._4_4_) * lStack_2f0;
            lVar93 = (local_508 - (int)local_318._4_4_) * lStack_330;
            local_540 = local_500;
            lVar84 = (long)iVar68;
            do {
              if ((~pEVar19[(lVar78 - iStack_350) * lVar9 +
                            (local_508 - (int)uVar41) * lVar1 + (lVar84 - (int)uVar40)].flag & 3) !=
                  0) {
                dVar12 = local_2f8[lVar79 + lVar86 + (lVar84 - (int)(undefined4)local_2d8)] *
                         local_2b8[(iVar75 - iStack_290) * local_2a8 +
                                   (local_508 - (int)local_298._4_4_) * lStack_2b0 +
                                   (lVar84 - (int)(undefined4)local_298)];
                local_338[lVar77 + lVar93 + (lVar84 - (int)(undefined4)local_318)] = dVar12;
                uVar111 = (ulong)(uint)local_278[(lVar78 - iStack_250) * local_268 +
                                                 (local_508 - (int)local_258._4_4_) * uStack_270 +
                                                 (lVar84 - (int)(undefined4)local_258)];
                if (0 < local_278[(lVar78 - iStack_250) * local_268 +
                                  (local_508 - (int)local_258._4_4_) * uStack_270 +
                                  (lVar84 - (int)(undefined4)local_258)]) {
                  local_5b0 = (int)lVar84;
                  piVar80 = local_540;
                  do {
                    lVar76 = (long)*piVar80;
                    lVar89 = (long)*(int *)((long)&lStack_238 + lVar76 * 4) + (long)local_5b0;
                    lVar88 = (long)local_1cc[lVar76] + (long)(int)local_508;
                    lVar76 = *(int *)((long)&local_160 + lVar76 * 4) + lVar78;
                    dVar12 = dVar12 + (local_2f8[lVar79 + lVar86 + (lVar84 - (int)(undefined4)
                                                                                  local_2d8) +
                                                                   LStack_2e0] *
                                      local_2b8[((int)lVar88 - local_298._4_4_) * lStack_2b0 +
                                                (long)((int)lVar89 - (undefined4)local_298) +
                                                ((int)lVar76 - iStack_290) * local_2a8]) /
                                      local_f0[(lVar88 - (int)local_d0._4_4_) * lStack_e8 +
                                               (lVar89 - (int)(undefined4)local_d0) +
                                               (lVar76 - iStack_c8) * local_e0];
                    local_338[lVar77 + lVar93 + (lVar84 - (int)(undefined4)local_318)] = dVar12;
                    piVar80 = piVar80 + uStack_260;
                    uVar111 = uVar111 - 1;
                  } while (uVar111 != 0);
                }
              }
              lVar84 = lVar84 + 1;
              local_540 = local_540 + 1;
            } while (iVar63 != (int)lVar84);
          }
          local_508 = local_508 + 1;
          local_500 = local_500 + uStack_270;
        } while (iVar64 != (int)local_508);
      }
      bVar113 = iVar75 != iVar67;
      iVar75 = iVar75 + 1;
    } while (bVar113);
  }
  pdVar10 = vfrac->p;
  lVar1 = vfrac->jstride;
  lVar9 = vfrac->kstride;
  uVar50 = (vfrac->begin).x;
  uVar51 = (vfrac->begin).y;
  iStack_350 = (int)*(undefined8 *)&(vfrac->begin).z;
  local_338 = cent_hat->p;
  lStack_330 = cent_hat->jstride;
  local_328 = cent_hat->kstride;
  LStack_320 = cent_hat->nstride;
  local_318._0_4_ = (cent_hat->begin).x;
  local_318._4_4_ = (cent_hat->begin).y;
  uVar18 = *(undefined8 *)&(cent_hat->begin).z;
  uVar52 = (cent_hat->end).y;
  uStack_308 = uVar52;
  uStack_304 = *(undefined8 *)&(cent_hat->end).z;
  iStack_310 = (int)uVar18;
  uStack_30c = (undefined4)((ulong)uVar18 >> 0x20);
  local_2f8 = ccent->p;
  lStack_2f0 = ccent->jstride;
  local_2e8 = ccent->kstride;
  LStack_2e0 = ccent->nstride;
  local_2d8._0_4_ = (ccent->begin).x;
  local_2d8._4_4_ = (ccent->begin).y;
  uVar18 = *(undefined8 *)&(ccent->begin).z;
  uVar53 = (ccent->end).y;
  aiStack_2cc[1] = uVar53;
  uStack_2c4 = *(undefined8 *)&(ccent->end).z;
  iStack_2d0 = (int)uVar18;
  aiStack_2cc[0] = (int)((ulong)uVar18 >> 0x20);
  local_2b8 = (double *)itracker->p;
  lStack_2b0 = itracker->jstride;
  local_2a8 = itracker->kstride;
  LStack_2a0 = itracker->nstride;
  local_298._0_4_ = (itracker->begin).x;
  local_298._4_4_ = (itracker->begin).y;
  uVar54 = (itracker->end).x;
  uVar55 = (itracker->end).y;
  iStack_290 = (int)*(undefined8 *)&(itracker->begin).z;
  aiStack_28c[0] = uVar54;
  aiStack_28c[1] = uVar55;
  uStack_284 = *(undefined8 *)&(itracker->end).z;
  local_278 = (int *)CONCAT44(iVar91,iVar102);
  uStack_270 = CONCAT44(iVar85,iVar81);
  local_268 = CONCAT44(iVar92,iVar90);
  uStack_260 = CONCAT44(iVar68,uVar7);
  local_258 = CONCAT44(iVar66,iVar69);
  iStack_250 = iVar70;
  iStack_24c = iVar71;
  local_248 = iVar67;
  local_244 = uVar6;
  pdVar11 = alpha->p;
  lStack_238 = alpha->jstride;
  local_230 = alpha->kstride;
  lStack_228 = alpha->nstride;
  local_220._0_4_ = (alpha->begin).x;
  local_220._4_4_ = (alpha->begin).y;
  uVar18 = *(undefined8 *)&(alpha->begin).z;
  uVar56 = (alpha->end).y;
  uStack_210 = uVar56;
  uStack_20c = *(undefined8 *)&(alpha->end).z;
  iStack_218 = (int)uVar18;
  uStack_214 = (undefined4)((ulong)uVar18 >> 0x20);
  local_240 = SUB84(pdVar11,0);
  uStack_23c = (undefined4)((ulong)pdVar11 >> 0x20);
  piVar80 = &DAT_00762c58;
  piVar87 = local_200;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *piVar87 = *piVar80;
    piVar80 = piVar80 + 1;
    piVar87 = piVar87 + 1;
  }
  puVar94 = &DAT_00762cc4;
  puVar101 = (undefined4 *)((long)&local_198 + 4);
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *puVar101 = *puVar94;
    puVar94 = puVar94 + 1;
    puVar101 = puVar101 + 1;
  }
  piVar80 = &DAT_00762d30;
  piVar87 = local_128;
  for (lVar79 = 0x1b; lVar79 != 0; lVar79 = lVar79 + -1) {
    *piVar87 = *piVar80;
    piVar80 = piVar80 + 1;
    piVar87 = piVar87 + 1;
  }
  pdVar57 = nrs->p;
  lStack_b0 = nrs->jstride;
  local_a8 = nrs->kstride;
  local_98._0_4_ = (nrs->begin).x;
  local_98._4_4_ = (nrs->begin).y;
  uVar18 = *(undefined8 *)&(nrs->begin).z;
  uVar58 = (nrs->end).y;
  uStack_88 = uVar58;
  uStack_84 = *(undefined8 *)&(nrs->end).z;
  local_90 = (int)uVar18;
  local_8c = (undefined4)((ulong)uVar18 >> 0x20);
  LStack_a0 = nrs->nstride;
  uStack_b8 = SUB84(pdVar57,0);
  uStack_b4 = (undefined4)((ulong)pdVar57 >> 0x20);
  local_78 = nbhd_vol->p;
  lStack_70 = nbhd_vol->jstride;
  local_68 = nbhd_vol->kstride;
  local_58._0_4_ = (nbhd_vol->begin).x;
  local_58._4_4_ = (nbhd_vol->begin).y;
  uVar59 = (nbhd_vol->end).x;
  uVar60 = (nbhd_vol->end).y;
  LStack_60 = nbhd_vol->nstride;
  iStack_50 = (int)*(undefined8 *)&(nbhd_vol->begin).z;
  uStack_4c = uVar59;
  uStack_48 = uVar60;
  uStack_44 = *(undefined8 *)&(nbhd_vol->end).z;
  if (iVar73 <= iVar65) {
    do {
      if (iVar62 <= iVar64) {
        lVar77 = (long)iVar73;
        lVar78 = (iVar73 - iStack_350) * lVar9;
        lVar79 = (long)iVar62;
        do {
          if (iVar61 <= iVar63) {
            lVar86 = (lVar79 - (int)uVar51) * lVar1;
            lVar93 = (lVar79 - (int)local_318._4_4_) * lStack_330;
            lVar89 = (lVar77 - iStack_310) * local_328;
            lVar76 = (lVar79 - (int)local_298._4_4_) * lStack_2b0;
            lVar109 = (lVar77 - iStack_290) * local_2a8;
            lVar88 = (lVar79 - (int)local_58._4_4_) * lStack_70;
            lVar96 = (lVar77 - iStack_50) * local_68;
            piVar80 = (int *)((long)local_2b8 +
                             ((long)iVar61 +
                             ((LStack_2a0 + lVar76 + lVar109) - (long)(int)(undefined4)local_298)) *
                             4);
            lVar84 = (long)iVar61;
            do {
              lVar95 = lVar84 - (int)uVar50;
              if (pdVar10[lVar78 + lVar86 + lVar95] <= 0.0) {
                lVar95 = lVar84 - (int)(undefined4)local_318;
                local_338[lVar93 + lVar89 + lVar95] = 1e+40;
                local_338[lVar93 + lVar89 + lVar95 + LStack_320] = 1e+40;
                local_338[lVar93 + lVar89 + lVar95 + LStack_320 * 2] = 1e+40;
              }
              else {
                pdVar2 = local_2f8 +
                         (lVar79 - (int)local_2d8._4_4_) * lStack_2f0 +
                         (iVar73 - iStack_2d0) * local_2e8 + (lVar84 - (int)(undefined4)local_2d8);
                lVar72 = lVar84 - (int)(undefined4)local_318;
                pdVar3 = local_338 + lVar93 + lVar89 + lVar72;
                local_338[lVar93 + lVar89 + lVar72] = *pdVar2;
                pdVar3[LStack_320] = pdVar2[LStack_2e0];
                pdVar3[LStack_320 * 2] = pdVar2[LStack_2e0 * 2];
                uVar111 = (ulong)*(uint *)((long)local_2b8 +
                                          (lVar76 + lVar109 + (lVar84 - (int)(undefined4)local_298))
                                          * 4);
                if (((((0 < (int)*(uint *)((long)local_2b8 +
                                          (lVar76 + lVar109 + (lVar84 - (int)(undefined4)local_298))
                                          * 4)) && (iVar102 <= lVar84)) &&
                     ((iVar91 <= lVar79 &&
                      (((iVar81 <= iVar73 && (lVar84 <= iVar85)) && (lVar79 <= iVar90)))))) &&
                    ((iVar73 <= iVar92 && (iVar68 <= lVar84)))) &&
                   ((iVar69 <= lVar79 &&
                    (((iVar66 <= iVar73 && (lVar84 <= iVar70)) &&
                     ((lVar79 <= iVar71 && (iVar73 <= iVar67)))))))) {
                  pdVar4 = pdVar11 + (lVar79 - (int)local_220._4_4_) * lStack_238 +
                                     (lVar77 - iStack_218) * local_230 +
                                     (lVar84 - (int)(undefined4)local_220);
                  *pdVar3 = *pdVar2 * *pdVar4 * pdVar10[lVar78 + lVar86 + lVar95];
                  pdVar3[LStack_320] =
                       pdVar2[LStack_2e0] * *pdVar4 * pdVar10[lVar78 + lVar86 + lVar95];
                  pdVar3[LStack_320 * 2] =
                       pdVar2[LStack_2e0 * 2] * *pdVar4 * pdVar10[lVar78 + lVar86 + lVar95];
                  piVar87 = piVar80;
                  do {
                    lVar95 = (long)*piVar87;
                    iVar75 = *(int *)((long)&local_198 + lVar95 * 4 + 4);
                    iVar83 = iVar75 + (int)lVar79;
                    iVar74 = local_128[lVar95];
                    iVar104 = local_200[lVar95] + (int)lVar84;
                    lVar110 = (long)iVar104 - (long)(int)(undefined4)local_98;
                    lVar103 = ((long)iVar83 - (long)(int)local_98._4_4_) * lStack_b0;
                    iVar108 = iVar73 + iVar74;
                    pdVar2 = local_2f8 +
                             ((long)iVar83 - (long)(int)local_2d8._4_4_) * lStack_2f0 +
                             (long)(iVar104 - (undefined4)local_2d8) +
                             (iVar108 - iStack_2d0) * local_2e8;
                    lVar72 = (long)(iVar104 - uVar50);
                    lVar105 = (iVar83 - uVar51) * lVar1;
                    lVar112 = (iVar108 - iStack_350) * lVar9;
                    lVar106 = ((long)iVar108 - (long)local_90) * local_a8;
                    *pdVar3 = (((double)local_200[lVar95] + *pdVar2) * pdVar4[lStack_228] *
                              pdVar10[lVar105 + lVar72 + lVar112]) /
                              pdVar57[lVar103 + lVar110 + lVar106] + *pdVar3;
                    pdVar3[LStack_320] =
                         (((double)iVar75 + pdVar2[LStack_2e0]) * pdVar4[lStack_228] *
                         pdVar10[lVar105 + lVar72 + lVar112]) / pdVar57[lVar103 + lVar110 + lVar106]
                         + pdVar3[LStack_320];
                    pdVar3[LStack_320 * 2] =
                         (((double)iVar74 + pdVar2[LStack_2e0 * 2]) * pdVar4[lStack_228] *
                         pdVar10[lVar105 + lVar72 + lVar112]) / pdVar57[lVar103 + lVar110 + lVar106]
                         + pdVar3[LStack_320 * 2];
                    piVar87 = piVar87 + LStack_2a0;
                    uVar111 = uVar111 - 1;
                  } while (uVar111 != 0);
                  lVar95 = lVar84 - (int)(undefined4)local_58;
                  *pdVar3 = *pdVar3 / local_78[lVar88 + lVar96 + lVar95];
                  pdVar3[LStack_320] = pdVar3[LStack_320] / local_78[lVar88 + lVar96 + lVar95];
                  pdVar3[LStack_320 * 2] =
                       pdVar3[LStack_320 * 2] / local_78[lVar88 + lVar96 + lVar95];
                }
              }
              lVar84 = lVar84 + 1;
              piVar80 = piVar80 + 1;
            } while (iVar5 + 4 != (int)lVar84);
          }
          lVar79 = lVar79 + 1;
        } while (iVar82 != (int)lVar79);
      }
      bVar113 = iVar73 != iVar65;
      iVar73 = iVar73 + 1;
    } while (bVar113);
  }
  return;
}

Assistant:

void
Redistribution::MakeStateRedistUtils ( Box const& bx,
                                       Array4<EBCellFlag const> const& flag,
                                       Array4<Real const> const& vfrac,
                                       Array4<Real const> const& ccent,
                                       Array4<int  const> const& itracker,
                                       Array4<Real      > const& nrs,
                                       Array4<Real      > const& alpha,
                                       Array4<Real      > const& nbhd_vol,
                                       Array4<Real      > const& cent_hat,
                                       Geometry const& lev_geom,
                                       Real target_vol)
{
    // Note that itracker has {4 in 2D, 8 in 3D} components and all are initialized to zero
    // We will add to the first component every time this cell is included in a merged neighborhood,
    //    either by merging or being merged
    //
    // In 2D, we identify the cells in the remaining three components with the following ordering
    //
    // ^  6 7 8
    // |  4   5
    // j  1 2 3
    //   i --->
    //
    // In 3D, We identify the cells in the remaining three components with the following ordering
    //
    //    at k-1   |   at k  |   at k+1
    //
    // ^  15 16 17 |  6 7 8  |  24 25 26
    // |  12 13 14 |  4   5  |  21 22 23
    // j  9  10 11 |  1 2 3  |  18 19 20
    //   i --->
    //
    // Note the first component of each of these arrays should never be used
    //
#if (AMREX_SPACEDIM == 2)
    Array<int,9> imap{0,-1, 0, 1,-1, 1,-1, 0, 1};
    Array<int,9> jmap{0,-1,-1,-1, 0, 0, 1, 1, 1};
    Array<int,9> kmap{0, 0, 0, 0, 0, 0, 0, 0, 0};
#else
    Array<int,27>    imap{0,-1, 0, 1,-1, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1,-1, 0, 1};
    Array<int,27>    jmap{0,-1,-1,-1, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1,-1,-1,-1, 0, 0, 0, 1, 1, 1};
    Array<int,27>    kmap{0, 0, 0, 0, 0, 0, 0, 0, 0,-1,-1,-1,-1,-1,-1,-1,-1,-1, 1, 1, 1, 1, 1, 1, 1, 1, 1};
#endif

    AMREX_D_TERM(const auto& is_periodic_x = lev_geom.isPeriodic(0);,
                 const auto& is_periodic_y = lev_geom.isPeriodic(1);,
                 const auto& is_periodic_z = lev_geom.isPeriodic(2););

    Box const& bxg2 = amrex::grow(bx,2);
    Box const& bxg3 = amrex::grow(bx,3);
    Box const& bxg4 = amrex::grow(bx,4);

    const Box domain = lev_geom.Domain();

    Box domain_per_grown = domain;
    if (is_periodic_x) domain_per_grown.grow(0,2);
    if (is_periodic_y) domain_per_grown.grow(1,2);
#if (AMREX_SPACEDIM == 3)
    if (is_periodic_z) domain_per_grown.grow(2,2);
#endif

    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // Everyone is in their own neighborhood at least
        nrs(i,j,k) = 1.;
        alpha(i,j,k,0) = 1.;
        alpha(i,j,k,1) = 1.;
    });

    // nrs captures how many neighborhoods (r,s) is in
    amrex::ParallelFor(bxg4,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
        for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
        {
            int r = i+imap[itracker(i,j,k,i_nbor)];
            int s = j+jmap[itracker(i,j,k,i_nbor)];
            int t = k+kmap[itracker(i,j,k,i_nbor)];
            if ( domain_per_grown.contains(IntVect(AMREX_D_DECL(r,s,t))) &&
                 bxg3.contains(IntVect(AMREX_D_DECL(r,s,t))) )
            {
                amrex::Gpu::Atomic::Add(&nrs(r,s,t),1.0_rt);
            }
        }
    });

    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // Start with the vfrac of (i,j,k)
            nbhd_vol(i,j,k) = vfrac(i,j,k) / nrs(i,j,k);
            Real vol_of_nbors = 0.;

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),vfrac(r,s,t) / nrs(r,s,t));
                vol_of_nbors += vfrac(r,s,t);
            }

            if (itracker(i,j,k,0) > 0)
                alpha(i,j,k,1) = (target_vol - vfrac(i,j,k)) / vol_of_nbors;

        } else {
            nbhd_vol(i,j,k) = 0.;
            alpha(i,j,k,0) = 0.;
            alpha(i,j,k,1) = 0.;
        }
    });

    // Define how much each cell keeps
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&alpha(r,s,t,0),-(alpha(i,j,k,1)/nrs(r,s,t)));
            }
        }
    });

    // Redefine nbhd_vol
    amrex::ParallelFor(bxg2,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (!flag(i,j,k).isCovered())
        {
            nbhd_vol(i,j,k)  = alpha(i,j,k,0) * vfrac(i,j,k);

            // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
            for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
            {
                int r = i+imap[itracker(i,j,k,i_nbor)];
                int s = j+jmap[itracker(i,j,k,i_nbor)];
                int t = k+kmap[itracker(i,j,k,i_nbor)];
                amrex::Gpu::Atomic::Add(&nbhd_vol(i,j,k),alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t));
            }
        }
    });

    // Define xhat,yhat,zhat (from Berger and Guliani)
    amrex::ParallelFor(bxg3,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        if (vfrac(i,j,k) > 0.0)
        {
            AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0);,
                         cent_hat(i,j,k,1) = ccent(i,j,k,1);,
                         cent_hat(i,j,k,2) = ccent(i,j,k,2););

            if ( itracker(i,j,k,0) > 0 &&
                 domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))) &&
                             bxg2.contains(IntVect(AMREX_D_DECL(i,j,k))) ) {

                AMREX_D_TERM(cent_hat(i,j,k,0) = ccent(i,j,k,0) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,1) = ccent(i,j,k,1) * alpha(i,j,k,0) *vfrac(i,j,k);,
                             cent_hat(i,j,k,2) = ccent(i,j,k,2) * alpha(i,j,k,0) *vfrac(i,j,k););

                // This loops over the neighbors of (i,j,k), and doesn't include (i,j,k) itself
                for (int i_nbor = 1; i_nbor <= itracker(i,j,k,0); i_nbor++)
                {
                    int ii = imap[itracker(i,j,k,i_nbor)]; int r = i+ii;
                    int jj = jmap[itracker(i,j,k,i_nbor)]; int s = j+jj;
                    int kk = kmap[itracker(i,j,k,i_nbor)]; int t = k+kk;

                    AMREX_D_TERM(cent_hat(i,j,k,0) += (ccent(r,s,t,0) + ii) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,1) += (ccent(r,s,t,1) + jj) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t);,
                                 cent_hat(i,j,k,2) += (ccent(r,s,t,2) + kk) * alpha(i,j,k,1) * vfrac(r,s,t) / nrs(r,s,t););
                }

                AMREX_D_TERM(cent_hat(i,j,k,0) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,1) /= nbhd_vol(i,j,k);,
                             cent_hat(i,j,k,2) /= nbhd_vol(i,j,k););
            }
        } else {

                AMREX_D_TERM(cent_hat(i,j,k,0) = 1.e40;,
                             cent_hat(i,j,k,1) = 1.e40;,
                             cent_hat(i,j,k,2) = 1.e40;);
        }
    });
}